

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void ngai_acc_common(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                    Integer *nbhandle)

{
  long lVar1;
  long lVar2;
  char *dst_ptr;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  armci_hdl_t *nb_handle;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  void *src_ptr;
  Integer *nbhandle_00;
  short sVar11;
  ulong uVar12;
  Integer *pIVar13;
  double dVar14;
  int proc;
  int local_448;
  int local_444;
  Integer *local_440;
  ulong local_438;
  ulong local_430;
  Integer *phi;
  Integer *plo;
  void *local_418;
  char *prem;
  double local_408;
  long local_400;
  void *local_3f8;
  long local_3f0;
  int stride_loc [7];
  int stride_rem [7];
  int count [7];
  Integer ga_nbhandle;
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  
  lVar6 = g_a + 1000;
  local_440 = lo;
  local_418 = alpha;
  local_3f8 = buf;
  if ((g_a < -1000) || (_max_global_array <= lVar6)) {
    sprintf((char *)&it_hdl,"%s: INVALID ARRAY HANDLE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  if (GA[lVar6].actv == 0) {
    sprintf((char *)&it_hdl,"%s: ARRAY NOT ACTIVE","ngai_acc_common");
    pnga_error((char *)&it_hdl,g_a);
  }
  local_444 = GA[lVar6].elemsize;
  local_438 = (ulong)(int)GA[lVar6].ndim;
  uVar3 = GA[lVar6].type - 0x3e9;
  if ((uVar3 < 7) && ((0x6fU >> (uVar3 & 0x1f) & 1) != 0)) {
    local_448 = *(int *)(&DAT_001ba578 + (ulong)uVar3 * 4);
  }
  else {
    pnga_error("type not supported",(long)GA[lVar6].type);
    local_448 = -1;
  }
  pIVar13 = local_440;
  gai_iterator_init(g_a,local_440,hi,&it_hdl);
  dVar14 = 1.0;
  uVar12 = local_438 & 0xffffffff;
  if (0 < (short)local_438) {
    lVar6 = 1;
    uVar8 = 0;
    do {
      lVar6 = lVar6 * ((hi[uVar8] - pIVar13[uVar8]) + 1);
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
    dVar14 = (double)lVar6;
  }
  local_400 = (long)local_444;
  local_408 = (double)local_444;
  GAbytes.acctot = dVar14 * local_408 + GAbytes.acctot;
  GAstat.numacc = GAstat.numacc + 1;
  nbhandle_00 = &ga_nbhandle;
  if (nbhandle != (Integer *)0x0) {
    nbhandle_00 = nbhandle;
  }
  ga_init_nbhandle(nbhandle_00);
  uVar8 = local_438 - 1;
  local_430 = 0;
  do {
    gai_iterator_reset(&it_hdl);
    while (iVar4 = gai_iterator_next(&it_hdl,&proc,&plo,&phi,&prem,ldrem), iVar4 != 0) {
      uVar5 = armci_domain_same_id(0,proc);
      dst_ptr = prem;
      uVar3 = (uint)(uVar5 == 0);
      if ((int)local_430 != 0) {
        uVar3 = uVar5;
      }
      if (uVar3 != 0) {
        lVar6 = *plo - *pIVar13;
        sVar11 = (short)local_438;
        if (1 < sVar11) {
          lVar9 = 1;
          uVar10 = 0;
          do {
            lVar9 = lVar9 * ld[uVar10];
            lVar1 = uVar10 + 1;
            lVar2 = uVar10 + 1;
            uVar10 = uVar10 + 1;
            lVar6 = lVar6 + (plo[lVar1] - pIVar13[lVar2]) * lVar9;
          } while (uVar8 != uVar10);
        }
        if (0 < sVar11) {
          uVar10 = 0;
          do {
            count[uVar10] = ((int)phi[uVar10] - (int)plo[uVar10]) + 1;
            uVar10 = uVar10 + 1;
          } while (uVar12 != uVar10);
        }
        count[0] = count[0] * local_444;
        stride_loc[0] = local_444;
        stride_rem[0] = local_444;
        if (1 < sVar11) {
          uVar10 = 0;
          iVar4 = local_444;
          iVar7 = local_444;
          do {
            iVar7 = iVar7 * (int)ldrem[uVar10];
            stride_rem[uVar10] = iVar7;
            iVar4 = iVar4 * (int)ld[uVar10];
            stride_loc[uVar10] = iVar4;
            stride_rem[uVar10 + 1] = iVar7;
            stride_loc[uVar10 + 1] = iVar4;
            uVar10 = uVar10 + 1;
          } while ((uVar8 & 0xffffffff) != uVar10);
        }
        if (GA_fence_set != 0) {
          fence_array[proc] = '\x01';
        }
        if (GAme == proc) {
          dVar14 = 1.0;
          if (0 < sVar11) {
            lVar9 = 1;
            uVar10 = 0;
            do {
              lVar9 = lVar9 * ((phi[uVar10] - plo[uVar10]) + 1);
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
            dVar14 = (double)lVar9;
          }
          GAbytes.accloc = dVar14 * local_408 + GAbytes.accloc;
        }
        src_ptr = (void *)(lVar6 * local_400 + (long)local_3f8);
        if (nbhandle == (Integer *)0x0) {
          ARMCI_AccS(local_448,local_418,src_ptr,stride_loc,prem,stride_rem,count,(int)uVar8,proc);
          pIVar13 = local_440;
        }
        else {
          local_3f0 = (long)proc;
          nb_handle = get_armci_nbhandle(nbhandle);
          ARMCI_NbAccS(local_448,local_418,src_ptr,stride_loc,dst_ptr,stride_rem,count,(int)uVar8,
                       (int)local_3f0,nb_handle);
          pIVar13 = local_440;
        }
      }
    }
    iVar4 = (int)local_430;
    local_430 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void ngai_acc_common(Integer g_a,
                   Integer *lo,
                   Integer *hi,
                   void    *buf,
                   Integer *ld,
                   void    *alpha,
                   Integer *nbhandle)
{
  Integer  p, np=0, handle=GA_OFFSET + g_a;
  Integer  idx, elems, size, type, p_handle, ga_nbhandle;
  int optype=-1, loop, ndim, cond;
  int proc;
  int num_loops=2; /* 1st loop for remote procs; 2nd loop for local procs */
  Integer n_rstrctd;
  Integer *rank_rstrctd;
  _iterator_hdl it_hdl;

  GA_Internal_Threadsafe_Lock();

  ga_check_handleM(g_a, "ngai_acc_common");

  size = GA[handle].elemsize;
  type = GA[handle].type;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  n_rstrctd = (Integer)GA[handle].num_rstrctd;
  rank_rstrctd = GA[handle].rank_rstrctd;

  if(type==C_DBL) optype= ARMCI_ACC_DBL;
  else if(type==C_FLOAT) optype= ARMCI_ACC_FLT;
  else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
  else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
  else if(type==C_INT)optype= ARMCI_ACC_INT;
  else if(type==C_LONG)optype= ARMCI_ACC_LNG;
  else pnga_error("type not supported",type);

  gai_iterator_init(g_a, lo, hi, &it_hdl);

#ifndef NO_GA_STATS
  gam_CountElems(ndim, lo, hi, &elems);
  GAbytes.acctot += (double)size*elems;
  GAstat.numacc++;
  GAstat.numacc_procs += np;
#endif

  if(nbhandle)ga_init_nbhandle(nbhandle);
  else ga_init_nbhandle(&ga_nbhandle);

#ifdef PROFILE_OLD
  ga_profile_start((int)handle, (long)size*elems, ndim, lo, hi,
      ENABLE_PROFILE_ACC);
#endif

  for(loop=0; loop<num_loops; loop++) {
    Integer ldrem[MAXDIM];
    int stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
    Integer idx_buf, *plo, *phi;
    char *pbuf, *prem;
    gai_iterator_reset(&it_hdl);

    while (gai_iterator_next(&it_hdl, &proc, &plo, &phi, &prem, ldrem)) {

      /* check if it is local to SMP */
      cond = armci_domain_same_id(ARMCI_DOMAIN_SMP,(int)proc);
      if(loop==0) cond = !cond;

      if(cond) {

        /* find the right spot in the user buffer */
        gam_ComputePatchIndex(ndim,lo, plo, ld, &idx_buf);
        pbuf = size*idx_buf + (char*)buf;

        gam_ComputeCount(ndim, plo, phi, count);

        /* scale number of rows by element size */
        count[0] *= size;
        gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);

        if(GA_fence_set)fence_array[proc]=1;

#ifndef NO_GA_STATS
        if(proc == GAme){
          gam_CountElems(ndim, plo, phi, &elems);
          GAbytes.accloc += (double)size*elems;
        }
#endif

        if(nbhandle) {
          ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem,
              stride_rem, count, ndim-1, proc,
              (armci_hdl_t*)get_armci_nbhandle(nbhandle));
        } else {
#  if !defined(DISABLE_NBOPT)
          if((loop==0 && gai_iterator_last(&it_hdl)) || loop==1) {
            ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, 
                count, ndim-1, proc);
          } else {
            ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem, 
                stride_rem, count, ndim-1, proc,
                (armci_hdl_t*)get_armci_nbhandle(&ga_nbhandle));
          }
#  else
          ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem,
              count, ndim-1, proc);
#  endif
        }
      } /* end if(cond) */
    }
  }
#if !defined(DISABLE_NBOPT)
  if(!nbhandle) nga_wait_internal(&ga_nbhandle);
#endif

#ifdef PROFILE_OLD
  ga_profile_stop();
#endif
  GA_Internal_Threadsafe_Unlock();

  gai_iterator_destroy(&it_hdl);
}